

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.cpp
# Opt level: O1

uint8_t __thiscall n_e_s::core::Ppu::read_byte(Ppu *this,uint16_t addr)

{
  PpuVram *pPVar1;
  byte bVar2;
  ushort uVar3;
  PpuRegisters *pPVar4;
  int iVar5;
  short sVar6;
  byte bVar7;
  undefined6 in_register_00000032;
  
  iVar5 = (int)CONCAT62(in_register_00000032,addr);
  if (iVar5 == 0x2007) {
    iVar5 = (*this->mmu_->_vptr_IMmu[3])
                      (this->mmu_,
                       (ulong)(this->registers_->vram_addr).super_Register<unsigned_short>.value_);
    bVar7 = (byte)iVar5;
    uVar3 = (this->registers_->vram_addr).super_Register<unsigned_short>.value_;
    if (uVar3 < 0x3f00) {
      bVar2 = this->read_buffer_;
      this->read_buffer_ = bVar7;
      bVar7 = bVar2;
    }
    else {
      iVar5 = (*this->mmu_->_vptr_IMmu[3])(this->mmu_,(ulong)(ushort)(uVar3 - 0x1000));
      this->read_buffer_ = (uint8_t)iVar5;
    }
    sVar6 = 0x20;
    if (((this->registers_->ctrl).value_ & 4) == 0) {
      sVar6 = 1;
    }
    pPVar1 = &this->registers_->vram_addr;
    (pPVar1->super_Register<unsigned_short>).value_ =
         (pPVar1->super_Register<unsigned_short>).value_ + sVar6;
  }
  else if (iVar5 == 0x2004) {
    bVar7 = this->oam_data_[this->registers_->oamaddr];
  }
  else {
    if (iVar5 != 0x2002) {
      iVar5 = (*this->mmu_->_vptr_IMmu[3])(this->mmu_,(ulong)addr);
      return (uint8_t)iVar5;
    }
    pPVar4 = this->registers_;
    bVar7 = (pPVar4->status).value_;
    pPVar4->write_toggle = false;
    (pPVar4->status).value_ = bVar7 & 0x7f;
  }
  return bVar7;
}

Assistant:

uint8_t Ppu::read_byte(uint16_t addr) {
    uint8_t byte = 0;

    if (addr == kPpuStatus) {
        byte = registers_->status.value();
        registers_->write_toggle = false;
        clear_vblank_flag();
    } else if (addr == kOamData) {
        byte = oam_data_[registers_->oamaddr];
    } else if (addr == kPpuData) {
        byte = mmu_->read_byte(registers_->vram_addr.value());
        if (registers_->vram_addr.value() < kFirstPaletteData) {
            const uint8_t tmp_buffer = read_buffer_;
            read_buffer_ = byte;
            byte = tmp_buffer;
        } else {
            read_buffer_ = mmu_->read_byte(registers_->vram_addr.value() -
                                           static_cast<uint16_t>(0x1000));
        }
        increment_vram_address();
    } else {
        byte = mmu_->read_byte(addr);
    }

    return byte;
}